

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

optional<pbrt::WrapMode> __thiscall pbrt::ParseWrapMode(pbrt *this,char *w)

{
  int iVar1;
  
  iVar1 = strcmp(w,"clamp");
  if (iVar1 == 0) {
    this[4] = (pbrt)0x1;
    *(undefined4 *)this = 2;
  }
  else {
    iVar1 = strcmp(w,"repeat");
    if (iVar1 == 0) {
      this[4] = (pbrt)0x1;
      *(undefined4 *)this = 0;
    }
    else {
      iVar1 = strcmp(w,"black");
      if (iVar1 == 0) {
        this[4] = (pbrt)0x1;
        *(undefined4 *)this = 1;
      }
      else {
        iVar1 = strcmp(w,"octahedralsphere");
        if (iVar1 == 0) {
          this[4] = (pbrt)0x1;
          *(undefined4 *)this = 3;
        }
        else {
          *(undefined8 *)this = 0;
        }
      }
    }
  }
  return (optional<pbrt::WrapMode>)this;
}

Assistant:

inline pstd::optional<WrapMode> ParseWrapMode(const char *w) {
    if (!strcmp(w, "clamp"))
        return WrapMode::Clamp;
    else if (!strcmp(w, "repeat"))
        return WrapMode::Repeat;
    else if (!strcmp(w, "black"))
        return WrapMode::Black;
    else if (!strcmp(w, "octahedralsphere"))
        return WrapMode::OctahedralSphere;
    else
        return {};
}